

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
          (polymorphic_allocator<pbrt::Image> *this,Image *p,Image *args)

{
  size_t sVar1;
  memory_resource *pmVar2;
  int iVar3;
  
  (p->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (args->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar3 = (args->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  p->format = args->format;
  (p->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar3;
  (p->channelNames).alloc.memoryResource = (args->channelNames).alloc.memoryResource;
  (p->channelNames).nStored = 0;
  (p->channelNames).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (p->channelNames).nAlloc = 0;
  sVar1 = (args->channelNames).nStored;
  (p->channelNames).nAlloc = (args->channelNames).nAlloc;
  (p->channelNames).nStored = sVar1;
  (p->channelNames).ptr = (args->channelNames).ptr;
  (args->channelNames).nStored = 0;
  (args->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (args->channelNames).nAlloc = 0;
  (p->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar2 = (args->p8).alloc.memoryResource;
  (p->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (args->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (p->p8).alloc.memoryResource = pmVar2;
  (p->p8).ptr = (uchar *)0x0;
  (p->p8).nAlloc = 0;
  (p->p8).nStored = 0;
  sVar1 = (args->p8).nStored;
  (p->p8).nAlloc = (args->p8).nAlloc;
  (p->p8).nStored = sVar1;
  (p->p8).ptr = (args->p8).ptr;
  (args->p8).nStored = 0;
  (args->p8).ptr = (uchar *)0x0;
  (args->p8).nAlloc = 0;
  (p->p16).alloc.memoryResource = (args->p16).alloc.memoryResource;
  (p->p16).nStored = 0;
  (p->p16).ptr = (Half *)0x0;
  (p->p16).nAlloc = 0;
  sVar1 = (args->p16).nStored;
  (p->p16).nAlloc = (args->p16).nAlloc;
  (p->p16).nStored = sVar1;
  (p->p16).ptr = (args->p16).ptr;
  (args->p16).nStored = 0;
  (args->p16).ptr = (Half *)0x0;
  (args->p16).nAlloc = 0;
  (p->p32).alloc.memoryResource = (args->p32).alloc.memoryResource;
  (p->p32).nStored = 0;
  (p->p32).ptr = (float *)0x0;
  (p->p32).nAlloc = 0;
  sVar1 = (args->p32).nStored;
  (p->p32).nAlloc = (args->p32).nAlloc;
  (p->p32).nStored = sVar1;
  (p->p32).ptr = (args->p32).ptr;
  (args->p32).nStored = 0;
  (args->p32).ptr = (float *)0x0;
  (args->p32).nAlloc = 0;
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}